

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  int iVar1;
  char *__dest;
  ulong uVar2;
  long lVar3;
  undefined1 *puVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ptrdiff_t _Num;
  size_t __n;
  char_type buffer [26];
  undefined8 uStack_50;
  undefined1 auStack_48 [40];
  
  __dest = *it;
  uVar7 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  __n = (size_t)iVar1;
  puVar4 = auStack_48 + __n;
  if (uVar7 < 100) {
    if (uVar7 < 10) goto LAB_0011dd18;
    uVar7 = (ulong)(uint)((int)uVar7 * 2);
    auStack_48[__n - 1] = internal::basic_data<void>::DIGITS[uVar7 + 1];
LAB_0011dd2d:
    puVar4 = puVar4 + -1;
  }
  else {
    iVar8 = 0;
    do {
      uVar6 = uVar7;
      uVar7 = uVar6 / 100;
      uVar2 = (ulong)(uint)(((int)uVar6 + (int)uVar7 * -100) * 2);
      puVar4[-1] = internal::basic_data<void>::DIGITS[uVar2 + 1];
      if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(num_writer *)(puVar4 + -2) = this[0xc];
        puVar4[-3] = internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar3 = -4;
          goto LAB_0011dcc7;
        }
        puVar4 = puVar4 + -3;
      }
      else {
        puVar4[-2] = internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar3 = -3;
LAB_0011dcc7:
          *(num_writer *)(puVar4 + lVar3) = this[0xc];
          puVar4 = puVar4 + lVar3;
        }
        else {
          puVar4 = puVar4 + -2;
        }
      }
      iVar8 = iVar8 + 2;
    } while (9999 < uVar6);
    if (uVar6 < 1000) {
LAB_0011dd18:
      bVar5 = (byte)uVar7 | 0x30;
      goto LAB_0011dd3c;
    }
    uVar7 = (ulong)(uint)((int)uVar7 * 2);
    puVar4[-1] = internal::basic_data<void>::DIGITS[uVar7 + 1];
    if (0x55555555 < iVar8 * -0x55555555 + 0xaaaaaaabU) goto LAB_0011dd2d;
    *(num_writer *)(puVar4 + -2) = this[0xc];
    puVar4 = puVar4 + -2;
  }
  bVar5 = internal::basic_data<void>::DIGITS[uVar7];
LAB_0011dd3c:
  puVar4[-1] = bVar5;
  if (iVar1 != 0) {
    uStack_50 = 0x11dd52;
    memcpy(__dest,auStack_48,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }